

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int PatchWeapon(int weapNum)

{
  byte *pbVar1;
  PClassAmmo *pPVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  int iVar7;
  uint statenum;
  size_t sVar8;
  ulong uVar9;
  FState *state;
  FDecalTemplate *pFVar10;
  char *pcVar11;
  AActor *defaults;
  PClassActor *local_600;
  FStateDefinitions statedef;
  BYTE dummy [1416];
  
  uVar3 = (ulong)(uint)weapNum;
  statedef.StateArray.Array = (FState *)0x0;
  statedef.StateArray.Most = 0;
  statedef.StateArray.Count = 0;
  statedef.StateLabels.Array = (FStateDefine *)0x0;
  statedef.StateLabels.Most = 0;
  statedef.StateLabels.Count = 0;
  statedef.laststate = (FState *)0x0;
  statedef.laststatebeforelabel = (FState *)0x0;
  statedef.lastlabel = -1;
  if (((uint)weapNum < 9) && ((uint)weapNum < WeaponNames.Count)) {
    local_600 = WeaponNames.Array[uVar3];
    if (local_600 != (PClassActor *)0x0) {
      defaults = (AActor *)(local_600->super_PClass).Defaults;
      bVar4 = false;
      DPrintf(4,"Weapon %d\n",uVar3);
      goto LAB_00433711;
    }
  }
  local_600 = (PClassActor *)0x0;
  Printf("Weapon %d out of range.\n",uVar3);
  defaults = (AActor *)dummy;
  bVar4 = true;
LAB_00433711:
  bVar5 = false;
LAB_00433714:
  do {
    iVar7 = GetLine();
    pcVar6 = Line2;
    if (iVar7 != 1) {
      if (defaults[1].sprev == (AActor **)0x0) {
        *(undefined4 *)&defaults[1].OldRenderPos.X = 0;
      }
      if (bVar5) {
        FStateDefinitions::InstallStates(&statedef,local_600,defaults);
      }
      FStateDefinitions::~FStateDefinitions(&statedef);
      return iVar7;
    }
    statenum = atoi(Line2);
    pcVar11 = Line1;
    sVar8 = strlen(Line1);
    if (8 < sVar8) {
      iVar7 = strcasecmp(pcVar11 + (sVar8 - 6)," frame");
      if (iVar7 != 0) {
        iVar7 = strcasecmp(pcVar11,"Ammo type");
        if (iVar7 == 0) {
          uVar9 = (ulong)statenum;
          if (AmmoNames.Count <= statenum) {
            uVar9 = 5;
          }
          if (0xb < statenum) {
            uVar9 = 5;
          }
          pPVar2 = AmmoNames.Array[uVar9];
          defaults[1].sprev = (AActor **)pPVar2;
          if ((pPVar2 != (PClassAmmo *)0x0) &&
             (*(int *)&defaults[1].__Pos.Y =
                   *(int *)((pPVar2->super_PClassInventory).super_PClassActor.super_PClass.Defaults
                           + 0x4a8) * 2, *(int *)&defaults[1].OldRenderPos.X == 0)) {
            *(undefined4 *)&defaults[1].OldRenderPos.X = 1;
          }
        }
        else {
LAB_00433838:
          Printf("Unknown key %s encountered in %s %d.\n",pcVar11,"Weapon",uVar3);
        }
        goto LAB_00433714;
      }
      state = FindState(statenum);
      if ((!bVar4) && (!bVar5)) {
        bVar5 = true;
        FStateDefinitions::MakeStateDefines(&statedef,local_600);
      }
      pcVar6 = Line1;
      iVar7 = strncasecmp(Line1,"Deselect",8);
      pcVar11 = "Select";
      if (iVar7 != 0) {
        iVar7 = strncasecmp(pcVar6,"Select",6);
        pcVar11 = "Deselect";
        if (iVar7 != 0) {
          iVar7 = strncasecmp(pcVar6,"Bobbing",7);
          pcVar11 = "Ready";
          if (iVar7 != 0) {
            iVar7 = strncasecmp(pcVar6,"Shooting",8);
            pcVar11 = "Fire";
            if (iVar7 != 0) {
              iVar7 = strncasecmp(pcVar6,"Firing",6);
              pcVar11 = "Flash";
              if (iVar7 != 0) goto LAB_00433714;
            }
          }
        }
      }
      FStateDefinitions::SetStateLabel(&statedef,pcVar11,state,'\x01');
      goto LAB_00433714;
    }
    iVar7 = strcasecmp(pcVar11,"Decal");
    if (iVar7 != 0) {
      iVar7 = strcasecmp(pcVar11,"Ammo use");
      if (iVar7 != 0) {
        iVar7 = strcasecmp(pcVar11,"Ammo per shot");
        if (iVar7 != 0) {
          iVar7 = strcasecmp(pcVar11,"Min ammo");
          if (iVar7 != 0) goto LAB_00433838;
          *(uint *)&defaults[1].__Pos.Z = statenum;
          goto LAB_00433714;
        }
      }
      *(uint *)&defaults[1].OldRenderPos.X = statenum;
      pbVar1 = (byte *)((long)&(defaults->flags6).Value + 3);
      *pbVar1 = *pbVar1 | 0x10;
      goto LAB_00433714;
    }
    stripwhite(pcVar6);
    pFVar10 = FDecalLib::GetDecalByName(&DecalLibrary,pcVar6);
    if (pFVar10 == (FDecalTemplate *)0x0) {
      Printf("Weapon %d: Unknown decal %s\n",uVar3,Line2);
    }
    else {
      defaults->DecalGenerator = &pFVar10->super_FDecalBase;
    }
  } while( true );
}

Assistant:

static int PatchWeapon (int weapNum)
{
	int result;
	PClassActor *type = NULL;
	BYTE dummy[sizeof(AWeapon)];
	AWeapon *info = (AWeapon *)&dummy;
	bool patchedStates = false;
	FStateDefinitions statedef;

	if (weapNum >= 0 && weapNum < 9 && (unsigned)weapNum < WeaponNames.Size())
	{
		type = WeaponNames[weapNum];
		if (type != NULL)
		{
			info = (AWeapon *)GetDefaultByType (type);
			DPrintf (DMSG_SPAMMY, "Weapon %d\n", weapNum);
		}
	}

	if (type == NULL)
	{
		Printf ("Weapon %d out of range.\n", weapNum);
	}

	while ((result = GetLine ()) == 1)
	{
		int val = atoi (Line2);

		if (strlen (Line1) >= 9)
		{
			if (stricmp (Line1 + strlen (Line1) - 6, " frame") == 0)
			{
				FState *state = FindState (val);

				if (type != NULL && !patchedStates)
				{
					statedef.MakeStateDefines(type);
					patchedStates = true;
				}

				if (strnicmp (Line1, "Deselect", 8) == 0)
					statedef.SetStateLabel("Select", state);
				else if (strnicmp (Line1, "Select", 6) == 0)
					statedef.SetStateLabel("Deselect", state);
				else if (strnicmp (Line1, "Bobbing", 7) == 0)
					statedef.SetStateLabel("Ready", state);
				else if (strnicmp (Line1, "Shooting", 8) == 0)
					statedef.SetStateLabel("Fire", state);
				else if (strnicmp (Line1, "Firing", 6) == 0)
					statedef.SetStateLabel("Flash", state);
			}
			else if (stricmp (Line1, "Ammo type") == 0)
			{
				if (val < 0 || val >= 12 || (unsigned)val >= AmmoNames.Size())
				{
					val = 5;
				}
				info->AmmoType1 = AmmoNames[val];
				if (info->AmmoType1 != NULL)
				{
					info->AmmoGive1 = ((AAmmo*)GetDefaultByType (info->AmmoType1))->Amount * 2;
					if (info->AmmoUse1 == 0)
					{
						info->AmmoUse1 = 1;
					}
				}
			}
			else
			{
				Printf (unknown_str, Line1, "Weapon", weapNum);
			}
		}
		else if (stricmp (Line1, "Decal") == 0)
		{
			stripwhite (Line2);
			const FDecalTemplate *decal = DecalLibrary.GetDecalByName (Line2);
			if (decal != NULL)
			{
				info->DecalGenerator = const_cast <FDecalTemplate *>(decal);
			}
			else
			{
				Printf ("Weapon %d: Unknown decal %s\n", weapNum, Line2);
			}
		}
		else if (stricmp (Line1, "Ammo use") == 0 || stricmp (Line1, "Ammo per shot") == 0)
		{
			info->AmmoUse1 = val;
			info->flags6 |= MF6_INTRYMOVE;	// flag the weapon for postprocessing (reuse a flag that can't be set by external means)
		}
		else if (stricmp (Line1, "Min ammo") == 0)
		{
			info->MinAmmo1 = val;
		}
		else
		{
			Printf (unknown_str, Line1, "Weapon", weapNum);
		}
	}

	if (info->AmmoType1 == NULL)
	{
		info->AmmoUse1 = 0;
	}

	if (patchedStates)
	{
		statedef.InstallStates(type, info);
	}

	return result;
}